

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Lexer * lex_new(Lexer *__return_storage_ptr__,VM *vm,char *path,char *code)

{
  __return_storage_ptr__->vm = vm;
  __return_storage_ptr__->path = path;
  __return_storage_ptr__->code = code;
  __return_storage_ptr__->cursor = 0;
  __return_storage_ptr__->line = 1;
  (__return_storage_ptr__->tk).type = 0x119;
  (__return_storage_ptr__->tk).start = 0;
  (__return_storage_ptr__->tk).length = 0;
  (__return_storage_ptr__->tk).line = 1;
  (__return_storage_ptr__->tk).field_4.num = 0.0;
  return __return_storage_ptr__;
}

Assistant:

Lexer lex_new(VM *vm, char *path, char *code) {
	Lexer lxr;
	lxr.vm = vm;
	lxr.path = path;
	lxr.code = code;
	lxr.cursor = 0;
	lxr.line = 1;
	lxr.tk.type = TK_EOF;
	lxr.tk.start = 0;
	lxr.tk.length = 0;
	lxr.tk.line = 1;
	lxr.tk.ident_hash = 0;
	return lxr;
}